

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

void __thiscall soplex::SPxSteepPR<double>::removedCoVecs(SPxSteepPR<double> *this,int *perm)

{
  SPxSolverBase<double> *pSVar1;
  pointer pdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  pSVar1 = (this->super_SPxPricer<double>).thesolver;
  pdVar2 = (pSVar1->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (ulong)((long)(pSVar1->coWeights).val.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2) >> 3;
  uVar5 = 0;
  uVar4 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    if (-1 < (long)perm[uVar5]) {
      pdVar2[perm[uVar5]] = pdVar2[uVar5];
    }
  }
  VectorBase<double>::reDim(&pSVar1->coWeights,(pSVar1->thecovectors->set).thenum,true);
  return;
}

Assistant:

void SPxSteepPR<R>::removedCoVecs(const int perm[])
{
   assert(this->thesolver != nullptr);
   VectorBase<R>& coWeights = this->thesolver->coWeights;
   int i;
   int j = coWeights.dim();

   for(i = 0; i < j; ++i)
   {
      if(perm[i] >= 0)
         coWeights[perm[i]] = coWeights[i];
   }

   coWeights.reDim(this->thesolver->dim());
}